

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.h
# Opt level: O0

void __thiscall
wasm::
SmallVector<wasm::Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>::Task,10ul>
::operator()(SmallVector<wasm::Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::__0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::__0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>::Task,10ul>
             *this,_func_void_Collector_ptr_Expression_ptr_ptr **Args,Expression ***Args_1)

{
  size_type __n;
  reference this_00;
  Expression ***Args_local_1;
  _func_void_Collector_ptr_Expression_ptr_ptr **Args_local;
  SmallVector<wasm::Walker<Collector,_wasm::Visitor<Collector,_void>_>::Task,_10UL> *this_local;
  
  if (*(ulong *)this < 10) {
    __n = *(size_type *)this;
    *(size_type *)this = __n + 1;
    this_00 = std::array<wasm::Walker<Collector,_wasm::Visitor<Collector,_void>_>::Task,_10UL>::
              operator[]((array<wasm::Walker<Collector,_wasm::Visitor<Collector,_void>_>::Task,_10UL>
                          *)(this + 8),__n);
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::Task::operator()(this_00,*Args,*Args_1);
  }
  else {
    std::
    vector<wasm::Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVAL...std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>::Task>>
    ::operator()((vector<wasm::Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::__0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::__0::TEMPNAMEPLACEHOLDERVAL___std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>__const__Collector_void>>__Task>>
                  *)(this + 0xa8),Args,Args_1);
  }
  return;
}

Assistant:

void emplace_back(ArgTypes&&... Args) {
    if (usedFixed < N) {
      new (&fixed[usedFixed++]) T(std::forward<ArgTypes>(Args)...);
    } else {
      flexible.emplace_back(std::forward<ArgTypes>(Args)...);
    }
  }